

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O2

Btor2Line * btor2parser_iter_next(Btor2LineIterator *it)

{
  long lVar1;
  int64_t iVar2;
  Btor2Line *pBVar3;
  
  lVar1 = it->next;
  if (lVar1 == 0) {
    pBVar3 = (Btor2Line *)0x0;
  }
  else {
    pBVar3 = it->reader->table[lVar1];
    iVar2 = find_non_zero_line_bfr(it->reader,lVar1 + 1);
    it->next = iVar2;
  }
  return pBVar3;
}

Assistant:

Btor2Line *
btor2parser_iter_next (Btor2LineIterator *it)
{
  Btor2Line *res;
  if (!it->next) return 0;
  assert (0 < it->next);
  assert (it->next < it->reader->ntable);
  res      = it->reader->table[it->next];
  it->next = find_non_zero_line_bfr (it->reader, it->next + 1);
  return res;
}